

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O2

size_t __thiscall proto2_preserve_unknown_enum_unittest::MyMessage::ByteSizeLong(MyMessage *this)

{
  RepeatedField<int> *pRVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  
  pRVar1 = &(this->field_0)._impl_.repeated_e_;
  sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar4 = google::protobuf::RepeatedField<int>::size(pRVar1);
  sVar7 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_packed_e_,1,
                     &(this->field_0)._impl_._repeated_packed_e_cached_byte_size_);
  pRVar1 = &(this->field_0)._impl_.repeated_packed_unexpected_e_;
  sVar8 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar1);
  uVar5 = google::protobuf::RepeatedField<int>::size(pRVar1);
  sVar6 = uVar5 + sVar8 + sVar7 + sVar6 + (ulong)uVar4;
  if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x1) !=
      (undefined1  [80])0x0) {
    uVar9 = (long)(this->field_0)._impl_.e_ | 1;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  uVar2 = (this->field_0)._impl_._oneof_case_[0];
  if ((uVar2 == 6) || (uVar2 == 5)) {
    uVar9 = (long)(this->field_0)._impl_.o_.oneof_e_1_ | 1;
    lVar3 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t MyMessage::ByteSizeLong() const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_e());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_e_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_packed_e(), 1, this_._impl_._repeated_packed_e_cached_byte_size_);
    }
    // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_packed_unexpected_e());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_packed_unexpected_e_size());
      total_size += data_size + tag_size;
    }
  }
   {
    // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_e());
    }
  }
  switch (this_.o_case()) {
    // .proto2_preserve_unknown_enum_unittest.MyEnum oneof_e_1 = 5;
    case kOneofE1: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_1());
      break;
    }
    // .proto2_preserve_unknown_enum_unittest.MyEnum oneof_e_2 = 6;
    case kOneofE2: {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_oneof_e_2());
      break;
    }
    case O_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}